

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-run.c
# Opt level: O2

ztresult_t
zt_run_statements(ztast_statement_t *statements,ztstruct_t *meta,ztregion_t *regions,int nregions,
                 ztloader_t **loaders,int nloaders,void *structure,char *errbuf)

{
  uint uVar1;
  ztast_value_type zVar2;
  int iVar3;
  ztast_assignment *pzVar4;
  ztast_id *__s2;
  ztfield_t *pzVar5;
  ztast_expr *pzVar6;
  ztast_value *pzVar7;
  undefined8 uVar8;
  int iVar9;
  ztast_value_data zVar10;
  ztresult_t zVar11;
  ulong uVar12;
  ulong uVar13;
  void *pvVar14;
  ztregion_t *pzVar15;
  ztarray *pzVar16;
  size_t sVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ztsyntaxerr_t e;
  ztstruct *meta_00;
  ztast_value zVar21;
  undefined4 in_register_0000008c;
  long lVar22;
  ulong uVar23;
  char *in_stack_ffffffffffffff90;
  
  lVar22 = CONCAT44(in_register_0000008c,nloaders);
  uVar12 = 0;
  if (0 < nregions) {
    uVar12 = (ulong)(uint)nregions;
  }
  do {
    if (statements == (ztast_statement_t *)0x0) {
      return 0;
    }
    if (statements->type != ZTSTMT_ASSIGNMENT) {
LAB_00101f2f:
      e = ztsyntx_UNSUPPORTED;
      goto LAB_00101f52;
    }
    pzVar4 = (statements->u).assignment;
    __s2 = pzVar4->id;
    uVar1 = meta->nfields;
    uVar19 = 0;
    if (0 < (int)uVar1) {
      uVar19 = (ulong)uVar1;
    }
    lVar20 = 8;
    for (uVar23 = 0; uVar19 != uVar23; uVar23 = uVar23 + 1) {
      iVar9 = strcmp(*(char **)((long)&meta->fields->type + lVar20),__s2->name);
      if (iVar9 == 0) {
        uVar19 = uVar23 & 0xffffffff;
        break;
      }
      lVar20 = lVar20 + 0x48;
    }
    if ((uint)uVar19 == uVar1) {
      zt_mksyntax((char *)structure,ztsyntx_UNKNOWN_FIELD);
    }
    pzVar5 = meta->fields;
    switch(pzVar5[uVar19].type) {
    case zttype_uchar:
      pzVar6 = pzVar4->expr;
      if (pzVar5[uVar19].nelems == 1) {
        if (pzVar6->type != ZTEXPR_VALUE) goto LAB_00101f37;
        if (((pzVar6->data).value)->type != ZTVAL_INTEGER) {
LAB_00101f3f:
          e = ztsyntx_NEED_INTEGER;
          goto LAB_00101f52;
        }
        uVar1 = (((pzVar6->data).value)->data).integer;
        if (0xff < uVar1) {
LAB_00101f2b:
          e = ztsyntx_VALUE_RANGE;
          goto LAB_00101f52;
        }
        *(char *)(lVar22 + pzVar5[uVar19].offset) = (char)uVar1;
      }
      else {
        if (pzVar6->type != ZTEXPR_INTARRAY) {
LAB_00101f3b:
          e = ztsyntx_NEED_INTEGERARRAY;
          goto LAB_00101f52;
        }
        zVar21 = *(pzVar6->data).value;
        if (zVar21 != (ztast_value)0x0) {
          sVar17 = pzVar5[uVar19].offset;
          for (lVar20 = 0; lVar20 < *(int *)zVar21; lVar20 = lVar20 + 1) {
            uVar1 = *(uint *)(*(long *)((long)zVar21 + 8) + lVar20 * 4);
            if (0xff < uVar1) goto LAB_00101f2b;
            *(char *)(sVar17 + lVar22 + lVar20) = (char)uVar1;
          }
        }
      }
      break;
    case zttype_ucharptr:
      pzVar6 = pzVar4->expr;
      if (pzVar5[uVar19].nelems == 1) {
        if (pzVar6->type != ZTEXPR_VALUE) goto LAB_00101f37;
        if (((pzVar6->data).value)->type != ZTVAL_INTEGER) goto LAB_00101f3f;
        uVar1 = (((pzVar6->data).value)->data).integer;
        if (0xff < uVar1) goto LAB_00101f2b;
        **(undefined1 **)(lVar22 + pzVar5[uVar19].offset) = (char)uVar1;
      }
      else {
        if (pzVar6->type != ZTEXPR_INTARRAY) goto LAB_00101f3b;
        zVar21 = *(pzVar6->data).value;
        if (zVar21 != (ztast_value)0x0) {
          lVar20 = *(long *)(lVar22 + pzVar5[uVar19].offset);
          for (lVar18 = 0; lVar18 < *(int *)zVar21; lVar18 = lVar18 + 1) {
            uVar1 = *(uint *)(*(long *)((long)zVar21 + 8) + lVar18 * 4);
            if (0xff < uVar1) goto LAB_00101f2b;
            *(char *)(lVar20 + lVar18) = (char)uVar1;
          }
        }
      }
      break;
    case zttype_ushort:
      pzVar6 = pzVar4->expr;
      if (pzVar5[uVar19].nelems == 1) {
        if (pzVar6->type != ZTEXPR_VALUE) goto LAB_00101f37;
        if (((pzVar6->data).value)->type != ZTVAL_INTEGER) goto LAB_00101f3f;
        uVar1 = (((pzVar6->data).value)->data).integer;
        if (0xffff < uVar1) goto LAB_00101f2b;
        *(short *)(lVar22 + pzVar5[uVar19].offset) = (short)uVar1;
      }
      else {
        if (pzVar6->type != ZTEXPR_INTARRAY) goto LAB_00101f3b;
        zVar21 = *(pzVar6->data).value;
        if (zVar21 != (ztast_value)0x0) {
          sVar17 = pzVar5[uVar19].offset;
          uVar19 = (ulong)*(uint *)zVar21;
          if ((int)*(uint *)zVar21 < 1) {
            uVar19 = 0;
          }
          for (uVar23 = 0; uVar19 != uVar23; uVar23 = uVar23 + 1) {
            uVar1 = *(uint *)(*(long *)((long)zVar21 + 8) + uVar23 * 4);
            if (0xffff < uVar1) goto LAB_00101f2b;
            *(short *)(sVar17 + lVar22 + uVar23 * 2) = (short)uVar1;
          }
        }
      }
      break;
    case zttype_ushortptr:
      pzVar6 = pzVar4->expr;
      if (pzVar5[uVar19].nelems == 1) {
        if (pzVar6->type != ZTEXPR_VALUE) goto LAB_00101f37;
        if (((pzVar6->data).value)->type != ZTVAL_INTEGER) goto LAB_00101f3f;
        uVar1 = (((pzVar6->data).value)->data).integer;
        if (0xffff < uVar1) goto LAB_00101f2b;
        **(undefined2 **)(lVar22 + pzVar5[uVar19].offset) = (short)uVar1;
      }
      else {
        if (pzVar6->type != ZTEXPR_INTARRAY) goto LAB_00101f3b;
        zVar21 = *(pzVar6->data).value;
        if (zVar21 != (ztast_value)0x0) {
          lVar20 = *(long *)(lVar22 + pzVar5[uVar19].offset);
          uVar19 = (ulong)*(uint *)zVar21;
          if ((int)*(uint *)zVar21 < 1) {
            uVar19 = 0;
          }
          for (uVar23 = 0; uVar19 != uVar23; uVar23 = uVar23 + 1) {
            uVar1 = *(uint *)(*(long *)((long)zVar21 + 8) + uVar23 * 4);
            if (0xffff < uVar1) goto LAB_00101f2b;
            *(short *)(lVar20 + uVar23 * 2) = (short)uVar1;
          }
        }
      }
      break;
    case zttype_uint:
      pzVar6 = pzVar4->expr;
      if (pzVar5[uVar19].nelems == 1) {
        if (pzVar6->type != ZTEXPR_VALUE) goto LAB_00101f37;
        if (((pzVar6->data).value)->type != ZTVAL_INTEGER) goto LAB_00101f3f;
        zVar10 = ((pzVar6->data).value)->data;
LAB_00101b6c:
        *(ztast_value_data *)(lVar22 + pzVar5[uVar19].offset) = zVar10;
      }
      else {
        if (pzVar6->type != ZTEXPR_INTARRAY) goto LAB_00101f3b;
        zVar21 = *(pzVar6->data).value;
        if (zVar21 != (ztast_value)0x0) {
          sVar17 = pzVar5[uVar19].offset;
          for (lVar20 = 0; lVar20 < *(int *)zVar21; lVar20 = lVar20 + 1) {
            *(undefined4 *)(sVar17 + lVar22 + lVar20 * 4) =
                 *(undefined4 *)(*(long *)((long)zVar21 + 8) + lVar20 * 4);
          }
        }
      }
      break;
    case zttype_uintptr:
      pzVar6 = pzVar4->expr;
      if (pzVar5[uVar19].nelems == 1) {
        if (pzVar6->type != ZTEXPR_VALUE) goto LAB_00101f37;
        if (((pzVar6->data).value)->type != ZTVAL_INTEGER) goto LAB_00101f3f;
        **(ztast_value_data **)(lVar22 + pzVar5[uVar19].offset) = ((pzVar6->data).value)->data;
      }
      else {
        if (pzVar6->type != ZTEXPR_INTARRAY) goto LAB_00101f3b;
        zVar21 = *(pzVar6->data).value;
        if (zVar21 != (ztast_value)0x0) {
          lVar20 = *(long *)(lVar22 + pzVar5[uVar19].offset);
          for (lVar18 = 0; lVar18 < *(int *)zVar21; lVar18 = lVar18 + 1) {
            *(undefined4 *)(lVar20 + lVar18 * 4) =
                 *(undefined4 *)(*(long *)((long)zVar21 + 8) + lVar18 * 4);
          }
        }
      }
      break;
    case zttype_struct:
      pzVar6 = pzVar4->expr;
      if (pzVar5[uVar19].nelems == 1) {
        if (pzVar6->type == ZTEXPR_SCOPE) {
          iVar9 = (int)pzVar5[uVar19].offset + nloaders;
          zVar21 = *(pzVar6->data).value;
          meta_00 = pzVar5[uVar19].metadata;
LAB_00101b08:
          iVar9 = zt_run_statements((ztast_statement_t *)zVar21,meta_00,regions,nregions,loaders,
                                    iVar9,structure,in_stack_ffffffffffffff90);
          goto LAB_00101b27;
        }
LAB_00101f43:
        e = ztsyntx_NEED_SCOPE;
        goto LAB_00101f52;
      }
      if (pzVar6->type != ZTEXPR_SCOPEARRAY) {
LAB_00101f47:
        e = ztsyntx_NEED_SCOPEARRAY;
        goto LAB_00101f52;
      }
      zVar21 = *(pzVar6->data).value;
      if (zVar21 == (ztast_value)0x0) goto LAB_00101f37;
      sVar17 = pzVar5[uVar19].offset;
      lVar20 = 0;
      while (lVar20 < *(int *)zVar21) {
        zVar11 = zt_run_statements((ztast_statement_t *)
                                   **(undefined8 **)(*(long *)((long)zVar21 + 8) + lVar20 * 8),
                                   pzVar5[uVar19].metadata,regions,nregions,loaders,
                                   (int)pzVar5[uVar19].size * (int)lVar20 + (int)sVar17 + nloaders,
                                   structure,in_stack_ffffffffffffff90);
        lVar20 = lVar20 + 1;
        if (zVar11 != 0) {
          return zVar11;
        }
      }
      break;
    case zttype_structptr:
      pzVar6 = pzVar4->expr;
      if (pzVar5[uVar19].nelems == 1) {
        if (pzVar6->type == ZTEXPR_SCOPE) {
          meta_00 = pzVar5[uVar19].metadata;
          iVar9 = (int)*(undefined8 *)(lVar22 + pzVar5[uVar19].offset);
          zVar21 = *(pzVar6->data).value;
          goto LAB_00101b08;
        }
        goto LAB_00101f43;
      }
      if (pzVar6->type != ZTEXPR_SCOPEARRAY) goto LAB_00101f47;
      zVar21 = *(pzVar6->data).value;
      if (zVar21 == (ztast_value)0x0) goto LAB_00101f37;
      uVar8 = *(undefined8 *)(lVar22 + pzVar5[uVar19].offset);
      lVar20 = 0;
      while (lVar20 < *(int *)zVar21) {
        zVar11 = zt_run_statements((ztast_statement_t *)
                                   **(undefined8 **)(*(long *)((long)zVar21 + 8) + lVar20 * 8),
                                   pzVar5[uVar19].metadata,regions,nregions,loaders,
                                   (int)pzVar5[uVar19].size * (int)lVar20 + (int)uVar8,structure,
                                   in_stack_ffffffffffffff90);
        lVar20 = lVar20 + 1;
        if (zVar11 != 0) {
          return zVar11;
        }
      }
      break;
    case zttype_staticarrayidx:
      if (pzVar5[uVar19].nelems != 1) goto LAB_00101f2f;
      pzVar16 = pzVar5[uVar19].array;
      uVar23 = pzVar16->length / (ulong)(long)pzVar16->nelems;
      if (pzVar4->expr->type != ZTEXPR_VALUE) goto LAB_00101f37;
      sVar17 = pzVar5[uVar19].offset;
      pzVar7 = (pzVar4->expr->data).value;
      zVar2 = pzVar7->type;
      if (zVar2 == ZTVAL_NIL) {
LAB_00101c6d:
        pvVar14 = (void *)0x0;
      }
      else {
        if (zVar2 != ZTVAL_INTEGER) {
LAB_00101f4f:
          e = ztsyntx_UNEXPECTED_VALUE_TYPE;
          goto LAB_00101f52;
        }
        iVar9 = (pzVar7->data).integer;
        lVar20 = (long)iVar9;
        if ((lVar20 < 0) || (pzVar16->nelems <= iVar9)) goto LAB_00101f2b;
LAB_00101c64:
        pvVar14 = (void *)(uVar23 * lVar20 + (long)pzVar16->base);
      }
      *(void **)(lVar22 + sVar17) = pvVar14;
      break;
    case zttype_arrayidx:
      uVar23 = 0;
      for (pzVar15 = regions;
          (uVar13 = uVar12, uVar12 != uVar23 &&
          (uVar13 = uVar23, pzVar5[uVar19].regionid != pzVar15->id)); pzVar15 = pzVar15 + 1) {
        uVar23 = uVar23 + 1;
      }
      if ((int)uVar13 == nregions) {
        e = ztsyntx_UNKNOWN_REGION;
        goto LAB_00101f52;
      }
      uVar13 = uVar13 & 0xffffffff;
      iVar9 = regions[uVar13].spec.nelems;
      uVar23 = regions[uVar13].spec.length / (ulong)(long)iVar9;
      if (pzVar5[uVar19].nelems != 1) goto LAB_00101f2f;
      if (pzVar4->expr->type == ZTEXPR_VALUE) {
        sVar17 = pzVar5[uVar19].offset;
        pzVar7 = (pzVar4->expr->data).value;
        zVar2 = pzVar7->type;
        if (zVar2 != ZTVAL_NIL) {
          if (zVar2 != ZTVAL_INTEGER) goto LAB_00101f4f;
          iVar3 = (pzVar7->data).integer;
          lVar20 = (long)iVar3;
          if ((-1 < lVar20) && (iVar3 < iVar9)) {
            pzVar16 = &regions[uVar13].spec;
            goto LAB_00101c64;
          }
          goto LAB_00101f2b;
        }
        goto LAB_00101c6d;
      }
      goto LAB_00101f37;
    case zttype_version:
      if (pzVar5[uVar19].nelems != 1) goto LAB_00101f2f;
      if (pzVar4->expr->type == ZTEXPR_VALUE) {
        pzVar7 = (pzVar4->expr->data).value;
        if (pzVar7->type != ZTVAL_DECIMAL) {
          e = ztsyntx_NEED_DECIMAL;
          goto LAB_00101f52;
        }
        zVar10 = pzVar7->data;
        if (999 < (uint)zVar10) goto LAB_00101f2b;
        goto LAB_00101b6c;
      }
LAB_00101f37:
      e = ztsyntx_NEED_VALUE;
LAB_00101f52:
      zt_mksyntax((char *)structure,e);
      return 0x30;
    case zttype_custom:
      if (pzVar5[uVar19].nelems != 1) goto LAB_00101f2f;
      iVar9 = (*loaders[pzVar5[uVar19].typeidx])
                        (pzVar4->expr,(void *)(pzVar5[uVar19].offset + lVar22),(char *)structure);
LAB_00101b27:
      if (iVar9 != 0) {
        return iVar9;
      }
    }
    statements = statements->next;
  } while( true );
}

Assistant:

static ztresult_t zt_run_statements(const ztast_statement_t *statements,
                                    const ztstruct_t        *meta,
                                    const ztregion_t        *regions,
                                    int                      nregions,
                                    ztloader_t             **loaders,
                                    int                      nloaders,
                                    void                    *structure,
                                    char                    *errbuf)
{
  ztresult_t               rc;
  const ztast_statement_t *statement;

  for (statement = statements; statement; statement = statement->next)
  {
    switch (statement->type)
    {
    case ZTSTMT_ASSIGNMENT:
      rc = zt_do_assignment(statement->u.assignment,
                            meta,
                            regions,
                            nregions,
                            loaders,
                            nloaders,
                            structure,
                            errbuf);
      if (rc)
        return rc;
      break;

    default:
      return zt_mksyntax(errbuf, ztsyntx_UNSUPPORTED);
    }
  }

  return ztresult_OK;
}